

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O3

void * raviX_malloc(size_t size)

{
  void *extraout_RAX;
  void *pvVar1;
  size_t in_RSI;
  
  pvVar1 = malloc(size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  raviX_malloc_cold_1();
  pvVar1 = calloc(size,in_RSI);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  raviX_calloc_cold_1();
  pvVar1 = realloc((void *)size,in_RSI);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  raviX_realloc_cold_1();
  free((void *)size);
  return extraout_RAX;
}

Assistant:

void *raviX_malloc(size_t size)
{
	void *ptr;
	ptr = malloc(size);
        if (!ptr) {
                fprintf(stderr, "out of memory\n");
                exit(1);
        }
	return ptr;
}